

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::New<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          Arena *arena)

{
  MessageLite *pMVar1;
  void *local_48;
  Arena *arena_local;
  MessageLite *prototype_for_copy_local;
  MessageLite *prototype_for_func_local;
  MessageCreator *this_local;
  
  if (arena == (Arena *)0x0) {
    local_48 = operator_new((ulong)this->allocation_size_);
  }
  else {
    local_48 = Arena::AllocateAligned(arena,(ulong)this->allocation_size_,8);
  }
  pMVar1 = PlacementNew<false,google::protobuf::MessageLite>
                     (this,prototype_for_func,prototype_for_copy,local_48,arena);
  return pMVar1;
}

Assistant:

PROTOBUF_ALWAYS_INLINE MessageLite* MessageCreator::New(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, Arena* arena) const {
  return PlacementNew<test_call>(prototype_for_func, prototype_for_copy,
                                 arena != nullptr
                                     ? arena->AllocateAligned(allocation_size_)
                                     : ::operator new(allocation_size_),
                                 arena);
}